

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPMacAlgorithm.cpp
# Opt level: O3

bool __thiscall OSSLEVPMacAlgorithm::verifyInit(OSSLEVPMacAlgorithm *this,SymmetricKey *key)

{
  bool bVar1;
  int iVar2;
  HMAC_CTX *ctx;
  undefined4 extraout_var;
  uchar *key_00;
  undefined4 extraout_var_00;
  size_t sVar3;
  undefined4 extraout_var_01;
  ByteString dummy;
  ByteString local_50;
  
  bVar1 = MacAlgorithm::verifyInit(&this->super_MacAlgorithm,key);
  if (bVar1) {
    ctx = (HMAC_CTX *)HMAC_CTX_new();
    this->curCTX = (HMAC_CTX *)ctx;
    if (ctx == (HMAC_CTX *)0x0) {
      softHSMLog(3,"verifyInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPMacAlgorithm.cpp"
                 ,0x93,"Failed to allocate space for HMAC_CTX");
      return false;
    }
    iVar2 = (*(key->super_Serialisable)._vptr_Serialisable[4])(key);
    key_00 = ByteString::const_byte_str((ByteString *)CONCAT44(extraout_var,iVar2));
    iVar2 = (*(key->super_Serialisable)._vptr_Serialisable[4])(key);
    sVar3 = ByteString::size((ByteString *)CONCAT44(extraout_var_00,iVar2));
    iVar2 = (*(this->super_MacAlgorithm)._vptr_MacAlgorithm[0xc])(this);
    iVar2 = HMAC_Init_ex(ctx,key_00,(int)sVar3,(EVP_MD *)CONCAT44(extraout_var_01,iVar2),
                         (ENGINE *)0x0);
    if (iVar2 != 0) {
      return true;
    }
    softHSMLog(3,"verifyInit",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPMacAlgorithm.cpp"
               ,0x9b,"HMAC_Init failed");
    HMAC_CTX_free(this->curCTX);
    this->curCTX = (HMAC_CTX *)0x0;
    ByteString::ByteString(&local_50);
    MacAlgorithm::verifyFinal(&this->super_MacAlgorithm,&local_50);
    local_50._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_50.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  return false;
}

Assistant:

bool OSSLEVPMacAlgorithm::verifyInit(const SymmetricKey* key)
{
	// Call the superclass initialiser
	if (!MacAlgorithm::verifyInit(key))
	{
		return false;
	}

	// Initialize the context
	curCTX = HMAC_CTX_new();
	if (curCTX == NULL)
	{
		ERROR_MSG("Failed to allocate space for HMAC_CTX");

		return false;
	}

	// Initialize EVP signing
	if (!HMAC_Init_ex(curCTX, key->getKeyBits().const_byte_str(), key->getKeyBits().size(), getEVPHash(), NULL))
	{
		ERROR_MSG("HMAC_Init failed");

		HMAC_CTX_free(curCTX);
		curCTX = NULL;

		ByteString dummy;
		MacAlgorithm::verifyFinal(dummy);

		return false;
	}

	return true;
}